

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::UnitTest::UnitTest(UnitTest *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  Mutex *unaff_retaddr;
  UnitTest *in_stack_00000088;
  UnitTestImpl *in_stack_00000090;
  
  *in_RDI = &PTR__UnitTest_001e1f70;
  internal::Mutex::Mutex(unaff_retaddr);
  pvVar1 = operator_new(0x2d0);
  internal::UnitTestImpl::UnitTestImpl(in_stack_00000090,in_stack_00000088);
  in_RDI[8] = pvVar1;
  return;
}

Assistant:

UnitTest::UnitTest() { impl_ = new internal::UnitTestImpl(this); }